

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::insert_move(Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
              *this,Node *keyval)

{
  uint8_t *puVar1;
  byte bVar2;
  Character CVar3;
  uchar *puVar4;
  _Head_base<0UL,_unsigned_char_*,_false> _Var5;
  byte *pbVar6;
  Vector2i VVar7;
  int iVar8;
  undefined4 uVar9;
  bool bVar10;
  uint8_t *puVar11;
  long lVar12;
  uint uVar13;
  Node *pNVar14;
  ulong uVar15;
  size_t insertion_idx;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar10 = try_increase_info(this);
    if (!bVar10) {
      throwOverflowError(this);
    }
  }
  CVar3 = (keyval->mData).first;
  uVar15 = (ulong)CVar3 * -0x3f1b720669c11bf9;
  uVar13 = ((uint)(uVar15 >> 0x20) & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f);
  insertion_idx = (uVar15 << 0x20 | uVar15 >> 0x20) >> 5 & this->mMask;
  puVar11 = this->mInfo;
  bVar2 = puVar11[insertion_idx];
  while (uVar13 = uVar13 + this->mInfoInc, uVar13 <= bVar2) {
    lVar12 = insertion_idx + 1;
    insertion_idx = insertion_idx + 1;
    bVar2 = puVar11[lVar12];
  }
  if (0xff < (uVar13 & 0xff) + this->mInfoInc) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar12 = 1;
  do {
    lVar12 = lVar12 + -1;
    puVar1 = puVar11 + insertion_idx;
    puVar11 = puVar11 + 1;
  } while (*puVar1 != '\0');
  pNVar14 = this->mKeyVals + insertion_idx;
  if (lVar12 == 0) {
    (pNVar14->mData).first = CVar3;
    iVar8 = (keyval->mData).second.advance;
    uVar9 = *(undefined4 *)&(keyval->mData).second.field_0xc;
    pbVar6 = (keyval->mData).second.bitmap_data;
    VVar7 = (keyval->mData).second.bitmap_dimensions;
    (pNVar14->mData).second.bearing = (keyval->mData).second.bearing;
    (pNVar14->mData).second.advance = iVar8;
    *(undefined4 *)&(pNVar14->mData).second.field_0xc = uVar9;
    (pNVar14->mData).second.bitmap_data = pbVar6;
    (pNVar14->mData).second.bitmap_dimensions = VVar7;
    (pNVar14->mData).second.color_format = (keyval->mData).second.color_format;
    (pNVar14->mData).second.bitmap_owned_data._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (keyval->mData).second.bitmap_owned_data._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (keyval->mData).second.bitmap_owned_data._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  }
  else {
    shiftUp(this,insertion_idx - lVar12,insertion_idx);
    (pNVar14->mData).first = (keyval->mData).first;
    iVar8 = (keyval->mData).second.advance;
    uVar9 = *(undefined4 *)&(keyval->mData).second.field_0xc;
    pbVar6 = (keyval->mData).second.bitmap_data;
    VVar7 = (keyval->mData).second.bitmap_dimensions;
    (pNVar14->mData).second.bearing = (keyval->mData).second.bearing;
    (pNVar14->mData).second.advance = iVar8;
    *(undefined4 *)&(pNVar14->mData).second.field_0xc = uVar9;
    (pNVar14->mData).second.bitmap_data = pbVar6;
    (pNVar14->mData).second.bitmap_dimensions = VVar7;
    (pNVar14->mData).second.color_format = (keyval->mData).second.color_format;
    puVar4 = (keyval->mData).second.bitmap_owned_data._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (keyval->mData).second.bitmap_owned_data._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    _Var5._M_head_impl =
         (pNVar14->mData).second.bitmap_owned_data._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (pNVar14->mData).second.bitmap_owned_data._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar4;
    if (_Var5._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var5._M_head_impl);
    }
  }
  this->mInfo[insertion_idx] = (uint8_t)uVar13;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }